

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O2

GLenum __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::TextureTypeIrrToGL
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this,E_TEXTURE_TYPE type)

{
  GLenum GVar1;
  double in_XMM0_Qa;
  
  GVar1 = 0xde1;
  if (type != ETT_2D) {
    if (type == ETT_CUBEMAP) {
      GVar1 = 0x8513;
    }
    else {
      os::Printer::log((Printer *)"COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type",
                       in_XMM0_Qa);
    }
  }
  return GVar1;
}

Assistant:

GLenum TextureTypeIrrToGL(E_TEXTURE_TYPE type) const
	{
		switch (type) {
		case ETT_2D:
			return GL_TEXTURE_2D;
		case ETT_CUBEMAP:
			return GL_TEXTURE_CUBE_MAP;
		}

		os::Printer::log("COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type", ELL_WARNING);
		return GL_TEXTURE_2D;
	}